

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O2

bool __thiscall
soplex::SoPlexBase<double>::getRowViolation
          (SoPlexBase<double> *this,double *maxviol,double *sumviol)

{
  bool bVar1;
  uint i;
  double dVar2;
  double dVar3;
  VectorBase<double> activity;
  
  bVar1 = isPrimalFeasible(this);
  if (bVar1) {
    _syncRealSolution(this);
    VectorBase<double>::VectorBase
              (&activity,
               (this->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
    (*(this->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x46])
              (this->_realLP,&this->_solReal,&activity,1);
    *maxviol = 0.0;
    *sumviol = 0.0;
    i = (this->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
    while (0 < (int)i) {
      i = i - 1;
      dVar2 = SPxLPBase<double>::lhsUnscaled(this->_realLP,i);
      dVar3 = SPxLPBase<double>::rhsUnscaled(this->_realLP,i);
      dVar2 = dVar2 - activity.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[i];
      if ((0.0 < dVar2) && (*sumviol = *sumviol + dVar2, *maxviol <= dVar2 && dVar2 != *maxviol)) {
        *maxviol = dVar2;
      }
      dVar3 = activity.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[i] - dVar3;
      if ((0.0 < dVar3) && (*sumviol = *sumviol + dVar3, *maxviol <= dVar3 && dVar3 != *maxviol)) {
        *maxviol = dVar3;
      }
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&activity);
  }
  return bVar1;
}

Assistant:

bool SoPlexBase<R>::getRowViolation(R& maxviol, R& sumviol)
{
   if(!isPrimalFeasible())
      return false;

   _syncRealSolution();
   VectorBase<R>& primal = _solReal._primal;
   assert(primal.dim() == numCols());

   VectorBase<R> activity(numRows());
   _realLP->computePrimalActivity(primal, activity, true);
   maxviol = 0.0;
   sumviol = 0.0;

   for(int i = numRows() - 1; i >= 0; i--)
   {
      R lhs = _realLP->lhsUnscaled(i);
      R rhs = _realLP->rhsUnscaled(i);

      R viol = lhs - activity[i];

      if(viol > 0.0)
      {
         sumviol += viol;

         if(viol > maxviol)
            maxviol = viol;
      }

      viol = activity[i] - rhs;

      if(viol > 0.0)
      {
         sumviol += viol;

         if(viol > maxviol)
            maxviol = viol;
      }
   }

   return true;
}